

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSHelper.h
# Opt level: O3

void __thiscall Assimp::D3DS::Node::Node(Node *this,string *name)

{
  pointer pcVar1;
  
  (this->mChildren).super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mChildren).super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->mParent = (Node *)0x0;
  (this->mChildren).super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mName)._M_dataplus._M_p = (pointer)&(this->mName).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mName,pcVar1,pcVar1 + name->_M_string_length);
  this->mInstanceNumber = 0;
  (this->mDummyName)._M_dataplus._M_p = (pointer)&(this->mDummyName).field_2;
  (this->mDummyName)._M_string_length = 0;
  (this->mDummyName).field_2._M_local_buf[0] = '\0';
  this->mHierarchyPos = 0;
  this->mHierarchyIndex = 0;
  memset(&this->aRotationKeys,0,0x84);
  this->mInstanceCount = 1;
  std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::reserve(&this->aRotationKeys,0x14);
  std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::reserve(&this->aPositionKeys,0x14);
  std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::reserve(&this->aScalingKeys,0x14);
  return;
}

Assistant:

explicit Node(const std::string &name)
    : mParent(NULL)
    , mName(name)
    , mInstanceNumber(0)
    , mHierarchyPos       (0)
    , mHierarchyIndex     (0)
    , mInstanceCount      (1)
    {
        aRotationKeys.reserve (20);
        aPositionKeys.reserve (20);
        aScalingKeys.reserve  (20);
    }